

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penalty_optimizer.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
penalty_optimizer::optimize
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,penalty_optimizer *this,
          vector<float,_std::allocator<float>_> *start_parameters)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  error_estimator *estimator;
  ostream *poVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> local_f8;
  vector<float,_std::allocator<float>_> local_e0;
  float local_c4;
  undefined1 local_c0 [4];
  float norm;
  undefined1 local_a8 [8];
  vector<float,_std::allocator<float>_> new_parameters;
  int iteration;
  int max_iterations;
  float acceptable_step_norm;
  undefined1 local_70 [8];
  nelder_mead mead_optimizer;
  float penalty_multipler;
  float penalty_value;
  vector<float,_std::allocator<float>_> *start_parameters_local;
  penalty_optimizer *this_local;
  vector<float,_std::allocator<float>_> *current_parameters;
  
  mead_optimizer._estimator._4_4_ = 10.0;
  mead_optimizer._estimator._0_4_ = 0x3dcccccd;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(start_parameters);
  nelder_mead::nelder_mead((nelder_mead *)local_70,(int)sVar2);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,start_parameters);
  new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 10;
  for (new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < 10;
      new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    peVar3 = std::
             __shared_ptr_access<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*(peVar3->super_error_estimator)._vptr_error_estimator[3])(mead_optimizer._estimator._4_4_);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_c0,__return_storage_ptr__);
    estimator = &std::__shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2> *)
                            this)->super_error_estimator;
    nelder_mead::optimize
              ((vector<float,_std::allocator<float>_> *)local_a8,(nelder_mead *)local_70,
               (vector<float,_std::allocator<float>_> *)local_c0,estimator);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_c0);
    vector_utils::sub(&local_f8,__return_storage_ptr__,
                      (vector<float,_std::allocator<float>_> *)local_a8);
    vector_utils::abs((vector_utils *)&local_e0,(int)&local_f8);
    fVar5 = vector_utils::sum(&local_e0);
    std::vector<float,_std::allocator<float>_>::~vector(&local_e0);
    std::vector<float,_std::allocator<float>_>::~vector(&local_f8);
    local_c4 = fVar5;
    std::vector<float,_std::allocator<float>_>::operator=
              (__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)local_a8);
    bVar1 = 0.0001 <= local_c4;
    if (bVar1) {
      mead_optimizer._estimator._4_4_ = mead_optimizer._estimator._4_4_ * 0.1;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_a8);
    if (!bVar1) break;
  }
  if (9 < (int)new_parameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
    poVar4 = log_info();
    poVar4 = std::operator<<(poVar4,"[Penalty optimizer] Maximum number of iterations reached (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
    poVar4 = std::operator<<(poVar4,").");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  nelder_mead::~nelder_mead((nelder_mead *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> penalty_optimizer::optimize(const std::vector<float>& start_parameters) const
{
  float penalty_value = 10.0f;
  const float penalty_multipler = 0.1f;

  nelder_mead mead_optimizer(start_parameters.size());

  auto current_parameters = start_parameters;
  const float acceptable_step_norm = 1e-4f;

  const int max_iterations = 10;
  int iteration = 0;

  for (; iteration < max_iterations; ++iteration)
  {
    _estimator->set_penalty_factor(penalty_value);
    auto new_parameters = mead_optimizer.optimize(current_parameters, _estimator.get());

    auto norm = vector_utils::sum(vector_utils::abs(vector_utils::sub(current_parameters, new_parameters)));
    
    current_parameters = new_parameters;

    if (norm < acceptable_step_norm)
    {
      break;
    }

    penalty_value *= penalty_multipler;
  }

  if (iteration >= max_iterations)
  {
    log_info() << "[Penalty optimizer] Maximum number of iterations reached (" << max_iterations << ")." << std::endl;
  }

  return current_parameters;
}